

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

void __thiscall
poplar::compact_bonsai_nlm<int,_64UL>::compact_bonsai_nlm
          (compact_bonsai_nlm<int,_64UL> *this,uint32_t capa_bits)

{
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *this_00;
  byte in_SIL;
  allocator_type *in_RDI;
  allocator_type *__n;
  
  this_00 = (vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             *)((ulong)(1L << ((ulong)in_SIL & 0x3f)) >> 6);
  __n = in_RDI;
  std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>::
  allocator((allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_> *)
            0x20c764);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::vector(this_00,(size_type)__n,in_RDI);
  std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>::
  ~allocator((allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_> *)
             0x20c784);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::size((vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
          *)in_RDI);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x20c7ad);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(size_type)__n,
             (allocator_type *)in_RDI);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x20c7cc);
  *(undefined8 *)((allocator_type *)in_RDI + 0x30) = 0;
  *(undefined8 *)((allocator_type *)in_RDI + 0x38) = 0;
  return;
}

Assistant:

explicit compact_bonsai_nlm(uint32_t capa_bits) : ptrs_((1ULL << capa_bits) / ChunkSize), chunks_(ptrs_.size()) {}